

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::CloseRelaxInst(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  DefUseManager *this_00;
  bool relax;
  bool hasStructOperand;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  uVar2 = Instruction::result_id(inst);
  if (uVar2 != 0) {
    uVar2 = Instruction::result_id(inst);
    bVar1 = IsRelaxed(this,uVar2);
    if ((!bVar1) && (bVar1 = IsFloat(this,inst,0x20), bVar1)) {
      bVar1 = IsDecoratedRelaxed(this,inst);
      if (bVar1) {
LAB_001c917e:
        uVar2 = Instruction::result_id(inst);
        AddRelaxed(this,uVar2);
        return true;
      }
      local_48._0_4_ = inst->opcode_;
      sVar3 = std::
              _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->closure_ops_)._M_h,(key_type *)local_48._M_pod_data);
      if (sVar3 != 0) {
        relax = true;
        hasStructOperand = false;
        local_48._8_8_ = (ConvertToHalfPass *)0x0;
        local_48._M_unused._M_object = operator_new(0x18);
        *(bool **)local_48._M_unused._0_8_ = &relax;
        *(bool **)((long)local_48._M_unused._0_8_ + 8) = &hasStructOperand;
        *(ConvertToHalfPass **)((long)local_48._M_unused._0_8_ + 0x10) = this;
        local_30 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:320:21)>
                   ::_M_invoke;
        local_38 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:320:21)>
                   ::_M_manager;
        Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_48);
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
        if (hasStructOperand == false) {
          if (relax == false) {
            relax = true;
            this_00 = Pass::get_def_use_mgr(&this->super_Pass);
            local_30 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:338:40)>
                       ::_M_invoke;
            local_38 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:338:40)>
                       ::_M_manager;
            local_48._M_unused._M_object = &relax;
            local_48._8_8_ = this;
            analysis::DefUseManager::ForEachUser
                      (this_00,inst,(function<void_(spvtools::opt::Instruction_*)> *)&local_48);
            if (local_38 != (code *)0x0) {
              (*local_38)(&local_48,&local_48,__destroy_functor);
            }
            if (relax != true) {
              return false;
            }
          }
          goto LAB_001c917e;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ConvertToHalfPass::CloseRelaxInst(Instruction* inst) {
  if (inst->result_id() == 0) return false;
  if (IsRelaxed(inst->result_id())) return false;
  if (!IsFloat(inst, 32)) return false;
  if (IsDecoratedRelaxed(inst)) {
    AddRelaxed(inst->result_id());
    return true;
  }
  if (closure_ops_.count(inst->opcode()) == 0) return false;
  // Can relax if all float operands are relaxed
  bool relax = true;
  bool hasStructOperand = false;
  inst->ForEachInId([&relax, &hasStructOperand, this](uint32_t* idp) {
    Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
    if (IsStruct(op_inst)) hasStructOperand = true;
    if (!IsFloat(op_inst, 32)) return;
    if (!IsRelaxed(*idp)) relax = false;
  });
  // If the instruction has a struct operand, we should not relax it, even if
  // all its uses are relaxed. Doing so could cause a mismatch between the
  // result type and the struct member type.
  if (hasStructOperand) {
    return false;
  }
  if (relax) {
    AddRelaxed(inst->result_id());
    return true;
  }
  // Can relax if all uses are relaxed
  relax = true;
  get_def_use_mgr()->ForEachUser(inst, [&relax, this](Instruction* uinst) {
    if (uinst->result_id() == 0 || !IsFloat(uinst, 32) ||
        (!IsDecoratedRelaxed(uinst) && !IsRelaxed(uinst->result_id())) ||
        !CanRelaxOpOperands(uinst)) {
      relax = false;
      return;
    }
  });
  if (relax) {
    AddRelaxed(inst->result_id());
    return true;
  }
  return false;
}